

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsdl-parser.cpp
# Opt level: O3

void __thiscall yactfr::internal::TsdlParser::TsdlParser(TsdlParser *this,char *begin,char *end)

{
  StrScanner::StrScanner(&this->_ss,begin,end);
  (this->_pseudoTraceType).super_type.m_initialized = false;
  this->_envParsed = false;
  (this->_stack).
  super__Vector_base<yactfr::internal::TsdlParser::_tStackFrame,_std::allocator<yactfr::internal::TsdlParser::_tStackFrame>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_stack).
  super__Vector_base<yactfr::internal::TsdlParser::_tStackFrame,_std::allocator<yactfr::internal::TsdlParser::_tStackFrame>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_stack).
  super__Vector_base<yactfr::internal::TsdlParser::_tStackFrame,_std::allocator<yactfr::internal::TsdlParser::_tStackFrame>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_fastPseudoFlIntTypes).
  super__Vector_base<yactfr::internal::TsdlParser::_tFastPseudoFlIntTypeEntry,_std::allocator<yactfr::internal::TsdlParser::_tFastPseudoFlIntTypeEntry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_fastPseudoFlIntTypes).
  super__Vector_base<yactfr::internal::TsdlParser::_tFastPseudoFlIntTypeEntry,_std::allocator<yactfr::internal::TsdlParser::_tFastPseudoFlIntTypeEntry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_fastPseudoFlIntTypes).
  super__Vector_base<yactfr::internal::TsdlParser::_tFastPseudoFlIntTypeEntry,_std::allocator<yactfr::internal::TsdlParser::_tFastPseudoFlIntTypeEntry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_traceType)._M_t.
  super___uniq_ptr_impl<const_yactfr::TraceType,_std::default_delete<const_yactfr::TraceType>_>._M_t
  .super__Tuple_impl<0UL,_const_yactfr::TraceType_*,_std::default_delete<const_yactfr::TraceType>_>.
  super__Head_base<0UL,_const_yactfr::TraceType_*,_false>._M_head_impl = (TraceType *)0x0;
  (this->_nativeBo).super_type.m_initialized = false;
  if (begin <= end) {
    _parseMetadata(this);
    return;
  }
  __assert_fail("end >= begin",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/eepp[P]yactfr/yactfr/internal/metadata/tsdl/tsdl-parser.cpp"
                ,0x2f0,
                "yactfr::internal::TsdlParser::TsdlParser(const char *const, const char *const)");
}

Assistant:

TsdlParser::TsdlParser(const char * const begin, const char * const end) :
    _ss {begin, end}
{
    assert(end >= begin);
    this->_parseMetadata();
}